

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

bool __thiscall
brotli::HashLongestMatch<15,_6,_10>::FindLongestMatch
          (HashLongestMatch<15,_6,_10> *this,uint8_t *data,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *puVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  size_t sVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint8_t *puVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  *best_len_code_out = 0;
  uVar23 = cur_ix & ring_buffer_mask;
  dVar26 = *best_score_out;
  uVar22 = *best_len_out;
  bVar5 = false;
  *best_len_out = 0;
  uVar7 = (ulong)((uint)max_length & 7);
  puVar1 = data + uVar23;
  uVar10 = 0;
  do {
    uVar6 = (long)(int)(&kDistanceCacheOffset)[uVar10] +
            (long)distance_cache[(uint)(&kDistanceCacheIndex)[uVar10]];
    if ((uVar6 <= max_backward && cur_ix - uVar6 < cur_ix) && (uVar22 + uVar23 <= ring_buffer_mask))
    {
      uVar13 = cur_ix - uVar6 & ring_buffer_mask;
      if ((uVar13 + uVar22 <= ring_buffer_mask) && (data[uVar22 + uVar23] == data[uVar13 + uVar22]))
      {
        if (7 < max_length) {
          lVar17 = 0;
          uVar14 = 0;
LAB_0016f61d:
          if (*(ulong *)(puVar1 + uVar14 * 8) == *(ulong *)(data + uVar14 * 8 + uVar13))
          goto code_r0x0016f62f;
          uVar14 = *(ulong *)(data + uVar14 * 8 + uVar13) ^ *(ulong *)(puVar1 + uVar14 * 8);
          uVar13 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          uVar14 = (uVar13 >> 3 & 0x1fffffff) - lVar17;
          goto LAB_0016f66e;
        }
        uVar15 = 0;
        puVar18 = puVar1;
LAB_0016f6f5:
        uVar14 = uVar15;
        if (uVar7 != 0) {
          uVar11 = uVar15 | uVar7;
          uVar20 = uVar7;
          do {
            uVar14 = uVar15;
            if (data[uVar15 + uVar13] != *puVar18) break;
            puVar18 = puVar18 + 1;
            uVar15 = uVar15 + 1;
            uVar20 = uVar20 - 1;
            uVar14 = uVar11;
          } while (uVar20 != 0);
        }
LAB_0016f66e:
        if (((2 < uVar14) || ((uVar10 < 2 && (uVar14 == 2)))) &&
           (auVar28._8_4_ = (int)(uVar14 >> 0x20), auVar28._0_8_ = uVar14,
           auVar28._12_4_ = 0x45300000,
           dVar27 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0)) * 5.4 -
                    (double)(&BackwardReferenceScoreUsingLastDistance(unsigned_long,unsigned_long)::
                              kDistanceShortCodeBitCost)[uVar10], dVar26 < dVar27)) {
          *best_len_out = uVar14;
          *best_len_code_out = uVar14;
          *best_distance_out = uVar6;
          *best_score_out = dVar27;
          bVar5 = true;
          uVar22 = uVar14;
          dVar26 = dVar27;
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 10);
  puVar1 = data + uVar23;
  uVar21 = (uint)(*(int *)(data + uVar23) * 0x1e35a7bd) >> 0x11;
  uVar2 = this->num_[uVar21];
  uVar7 = (ulong)uVar2;
  uVar10 = 0;
  if (0x40 < uVar2) {
    uVar10 = (ulong)(uVar2 - 0x40);
  }
  if (uVar10 < uVar7) {
    uVar6 = (ulong)((uint)max_length & 7);
    do {
      uVar7 = uVar7 - 1;
      uVar3 = *(uint *)((long)this->buckets_[0] +
                       (ulong)((uint)uVar7 & 0x3f) * 4 + (ulong)(uVar21 << 8));
      uVar13 = cur_ix - uVar3;
      iVar19 = 5;
      if ((uVar13 != 0) && (uVar13 <= max_backward)) {
        iVar19 = 6;
        if (uVar22 + uVar23 <= ring_buffer_mask) {
          uVar14 = (ulong)(uVar3 & (uint)ring_buffer_mask);
          if ((uVar14 + uVar22 <= ring_buffer_mask) &&
             (data[uVar22 + uVar23] == data[uVar14 + uVar22])) {
            if (7 < max_length) {
              lVar17 = 0;
              uVar15 = 0;
LAB_0016f822:
              if (*(ulong *)(puVar1 + uVar15 * 8) == *(ulong *)(data + uVar15 * 8 + uVar14))
              goto code_r0x0016f834;
              uVar15 = *(ulong *)(data + uVar15 * 8 + uVar14) ^ *(ulong *)(puVar1 + uVar15 * 8);
              uVar14 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar15 = (uVar14 >> 3 & 0x1fffffff) - lVar17;
              goto LAB_0016f85f;
            }
            puVar18 = puVar1;
            uVar20 = 0;
LAB_0016f8ea:
            uVar15 = uVar20;
            if (uVar6 != 0) {
              uVar16 = uVar20 | uVar6;
              uVar11 = uVar6;
              do {
                uVar15 = uVar20;
                if (data[uVar20 + uVar14] != *puVar18) break;
                puVar18 = puVar18 + 1;
                uVar20 = uVar20 + 1;
                uVar11 = uVar11 - 1;
                uVar15 = uVar16;
              } while (uVar11 != 0);
            }
LAB_0016f85f:
            iVar19 = 0;
            if (3 < uVar15) {
              auVar29._8_4_ = (int)(uVar15 >> 0x20);
              auVar29._0_8_ = uVar15;
              auVar29._12_4_ = 0x45300000;
              iVar4 = 0x1f;
              if ((uint)uVar13 != 0) {
                for (; (uint)uVar13 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              dVar27 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0)) * 5.4 +
                       (double)iVar4 * -1.2;
              if (dVar26 < dVar27) {
                *best_len_out = uVar15;
                *best_len_code_out = uVar15;
                *best_distance_out = uVar13;
                *best_score_out = dVar27;
                bVar5 = true;
                uVar22 = uVar15;
                dVar26 = dVar27;
                iVar19 = 0;
              }
            }
          }
        }
      }
    } while (((iVar19 == 6) || (iVar19 == 0)) && (uVar10 < uVar7));
  }
  *(int *)((long)this->buckets_[0] + (ulong)(uVar2 & 0x3f) * 4 + (ulong)(uVar21 << 8)) = (int)cur_ix
  ;
  this->num_[uVar21] = uVar2 + 1;
  if ((!bVar5) && (this->num_dict_lookups_ >> 7 <= this->num_dict_matches_)) {
    uVar22 = (ulong)(uVar21 & 0xfffffffe);
    sVar9 = this->num_dict_lookups_;
    sVar12 = this->num_dict_matches_;
    iVar19 = 0;
    do {
      sVar9 = sVar9 + 1;
      this->num_dict_lookups_ = sVar9;
      uVar2 = *(ushort *)(kStaticDictionaryHash + uVar22 * 2);
      if (uVar2 != 0) {
        uVar21 = uVar2 & 0x1f;
        uVar10 = (ulong)uVar21;
        if (uVar10 <= max_length) {
          puVar18 = kBrotliDictionary +
                    uVar10 * (uVar2 >> 5) + (ulong)kBrotliDictionaryOffsetsByLength[uVar10];
          if (7 < uVar21) {
            uVar23 = (ulong)(uVar2 & 0x18);
            puVar8 = puVar18 + uVar23;
            uVar7 = 0;
LAB_0016f9ff:
            if (*(ulong *)(puVar18 + uVar7) == *(ulong *)(puVar1 + uVar7)) goto code_r0x0016fa11;
            uVar6 = *(ulong *)(puVar1 + uVar7) ^ *(ulong *)(puVar18 + uVar7);
            uVar23 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            uVar7 = (uVar23 >> 3 & 0x1fffffff) + uVar7;
            goto LAB_0016fa30;
          }
          uVar23 = 0;
          puVar8 = puVar18;
LAB_0016fb12:
          uVar6 = uVar10 & 7;
          uVar7 = uVar23;
          if ((uVar2 & 7) != 0) {
            uVar13 = uVar23 | uVar6;
            do {
              uVar7 = uVar23;
              if (puVar1[uVar23] != *puVar8) break;
              puVar8 = puVar8 + 1;
              uVar23 = uVar23 + 1;
              uVar6 = uVar6 - 1;
              uVar7 = uVar13;
            } while (uVar6 != 0);
          }
LAB_0016fa30:
          if ((uVar7 != 0) && (uVar10 < uVar7 + 10)) {
            sVar24 = (ulong)(uVar2 >> 5) + max_backward + 1 +
                     (long)(1 << (""[uVar10] & 0x1f)) *
                     (ulong)(byte)kCutoffTransforms[uVar10 - uVar7];
            auVar30._8_4_ = (int)(uVar7 >> 0x20);
            auVar30._0_8_ = uVar7;
            auVar30._12_4_ = 0x45300000;
            iVar4 = 0x1f;
            uVar21 = (uint)sVar24;
            if (uVar21 != 0) {
              for (; uVar21 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            dVar27 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 5.4 +
                     (double)iVar4 * -1.2;
            if (dVar26 < dVar27) {
              sVar12 = sVar12 + 1;
              this->num_dict_matches_ = sVar12;
              *best_len_out = uVar7;
              *best_len_code_out = uVar10;
              *best_distance_out = sVar24;
              *best_score_out = dVar27;
              bVar5 = true;
              dVar26 = dVar27;
            }
          }
        }
      }
      uVar22 = uVar22 + 1;
      bVar25 = iVar19 == 0;
      iVar19 = iVar19 + 1;
    } while (bVar25);
  }
  return bVar5;
code_r0x0016f62f:
  uVar14 = uVar14 + 1;
  lVar17 = lVar17 + -8;
  uVar15 = max_length & 0xfffffffffffffff8;
  puVar18 = puVar1 + (max_length & 0xfffffffffffffff8);
  if (max_length >> 3 == uVar14) goto LAB_0016f6f5;
  goto LAB_0016f61d;
code_r0x0016f834:
  uVar15 = uVar15 + 1;
  lVar17 = lVar17 + -8;
  puVar18 = puVar1 + (max_length & 0xfffffffffffffff8);
  uVar20 = max_length & 0xfffffffffffffff8;
  if (max_length >> 3 == uVar15) goto LAB_0016f8ea;
  goto LAB_0016f822;
code_r0x0016fa11:
  uVar7 = uVar7 + 8;
  if (uVar23 == uVar7) goto LAB_0016fb12;
  goto LAB_0016f9ff;
}

Assistant:

bool FindLongestMatch(const uint8_t * __restrict data,
                        const size_t ring_buffer_mask,
                        const int* __restrict distance_cache,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        size_t * __restrict best_len_out,
                        size_t * __restrict best_len_code_out,
                        size_t * __restrict best_distance_out,
                        double * __restrict best_score_out) {
    *best_len_code_out = 0;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    bool match_found = false;
    // Don't accept a short copy from far away.
    double best_score = *best_score_out;
    size_t best_len = *best_len_out;
    *best_len_out = 0;
    // Try last distance first.
    for (size_t i = 0; i < kNumLastDistancesToCheck; ++i) {
      const size_t idx = kDistanceCacheIndex[i];
      const size_t backward =
          static_cast<size_t>(distance_cache[idx] + kDistanceCacheOffset[i]);
      size_t prev_ix = static_cast<size_t>(cur_ix - backward);
      if (prev_ix >= cur_ix) {
        continue;
      }
      if (PREDICT_FALSE(backward > max_backward)) {
        continue;
      }
      prev_ix &= ring_buffer_mask;

      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 3 || (len == 2 && i < 2)) {
        // Comparing for >= 2 does not change the semantics, but just saves for
        // a few unnecessary binary logarithms in backward reference score,
        // since we are not interested in such short matches.
        double score = BackwardReferenceScoreUsingLastDistance(len, i);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    const uint32_t * __restrict const bucket = &buckets_[key][0];
    const size_t down = (num_[key] > kBlockSize) ? (num_[key] - kBlockSize) : 0;
    for (size_t i = num_[key]; i > down;) {
      --i;
      size_t prev_ix = bucket[i & kBlockMask];
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        // Comparing for >= 3 does not change the semantics, but just saves
        // for a few unnecessary binary logarithms in backward reference
        // score, since we are not interested in such short matches.
        double score = BackwardReferenceScore(len, backward);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    buckets_[key][num_[key] & kBlockMask] = static_cast<uint32_t>(cur_ix);
    ++num_[key];
    if (!match_found && num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      size_t dict_key = Hash<14>(&data[cur_ix_masked]) << 1;
      for (int k = 0; k < 2; ++k, ++dict_key) {
        ++num_dict_lookups_;
        const uint16_t v = kStaticDictionaryHash[dict_key];
        if (v > 0) {
          const size_t len = v & 31;
          const size_t dist = v >> 5;
          const size_t offset =
              kBrotliDictionaryOffsetsByLength[len] + len * dist;
          if (len <= max_length) {
            const size_t matchlen =
                FindMatchLengthWithLimit(&data[cur_ix_masked],
                                         &kBrotliDictionary[offset], len);
            if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
              const size_t transform_id = kCutoffTransforms[len - matchlen];
              const size_t word_id =
                  transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                  dist;
              const size_t backward = max_backward + word_id + 1;
              double score = BackwardReferenceScore(matchlen, backward);
              if (best_score < score) {
                ++num_dict_matches_;
                best_score = score;
                best_len = matchlen;
                *best_len_out = best_len;
                *best_len_code_out = len;
                *best_distance_out = backward;
                *best_score_out = best_score;
                match_found = true;
              }
            }
          }
        }
      }
    }
    return match_found;
  }